

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O0

void __thiscall LTFlightData::~LTFlightData(LTFlightData *this)

{
  long in_RDI;
  deque<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_> *unaff_retaddr;
  system_error *e;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  FDStaticData *in_stack_ffffffffffffffb0;
  LTFlightData *in_stack_ffffffffffffffc0;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8
            );
  DestroyAircraft(in_stack_ffffffffffffffc0);
  if (*(long *)(in_RDI + 0x368) != 0) {
    XPLMDestroyProbe(*(undefined8 *)(in_RDI + 0x368));
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1d1886);
  FDStaticData::~FDStaticData(in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string((string *)(in_RDI + 0x1a8));
  std::deque<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>::~deque
            (unaff_retaddr);
  std::deque<positionTy,_std::allocator<positionTy>_>::~deque
            ((deque<positionTy,_std::allocator<positionTy>_> *)unaff_retaddr);
  std::deque<positionTy,_std::allocator<positionTy>_>::~deque
            ((deque<positionTy,_std::allocator<positionTy>_> *)unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 0x38));
  FDKeyTy::~FDKeyTy((FDKeyTy *)0x1d18fb);
  return;
}

Assistant:

LTFlightData::~LTFlightData()
{
    try {
//        LOG_MSG(logDEBUG, "FD destroyed for %s", key().c_str());
        // access guarded by a mutex
        std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);
        // make sure aircraft is removed, too
        DestroyAircraft();
        // Release probe handle
        if (probeRef)
            XPLMDestroyProbe(probeRef);
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
}